

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O0

bool __thiscall
Lambertian::Scatter(Lambertian *this,Ray *ray_in,hit_record_t *hit_record,Vec3 *attenuation,
                   Ray *ray_out)

{
  float *in_RCX;
  long in_RDX;
  Ray *this_00;
  Ray *in_RSI;
  Vec3 *in_RDI;
  undefined8 *in_R8;
  Vec3 _target;
  Vec3 *in_stack_ffffffffffffff60;
  Vec3 local_90;
  float in_stack_ffffffffffffff7c;
  Vec3 *in_stack_ffffffffffffff80;
  Vec3 *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uStack_68;
  undefined8 uStack_64;
  Vec3 local_4c;
  Vec3 local_40;
  Vec3 local_34;
  undefined8 *local_28;
  float *local_20;
  long local_18;
  Ray *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  operator+(in_RDI,in_stack_ffffffffffffff60);
  random_in_unit_disk();
  operator+(in_RDI,in_stack_ffffffffffffff60);
  Vec3::~Vec3(&local_4c);
  Vec3::~Vec3(&local_40);
  this_00 = (Ray *)(local_18 + 0xc);
  operator-(in_RDI,(Vec3 *)this_00);
  Ray::GetTime(local_10);
  Ray::Ray((Ray *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
           in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  *(ulong *)((long)local_28 + 0xc) = CONCAT44(uStack_68,in_stack_ffffffffffffff94);
  *(undefined8 *)((long)local_28 + 0x14) = uStack_64;
  *local_28 = in_stack_ffffffffffffff88;
  local_28[1] = CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  Ray::~Ray(this_00);
  Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff7c);
  (**(code **)(**(long **)(in_RDI->e + 2) + 0x10))
            (*(undefined4 *)(local_18 + 4),*(undefined4 *)(local_18 + 8),&local_90,
             *(long **)(in_RDI->e + 2),local_18 + 0xc);
  *(undefined8 *)local_20 = local_90.e._0_8_;
  local_20[2] = local_90.e[2];
  Vec3::~Vec3(&local_90);
  Vec3::~Vec3(&local_34);
  return true;
}

Assistant:

bool
Lambertian::Scatter(const Ray& ray_in, hit_record_t& hit_record, Vec3& attenuation, Ray& ray_out) const
{
    Vec3 _target = hit_record.m_point + hit_record.m_normal + random_in_unit_disk();

    ray_out      = Ray(hit_record.m_point, _target - hit_record.m_point, ray_in.GetTime());
    attenuation  = m_albedo->GetValue(hit_record.m_u, hit_record.m_v, hit_record.m_point);;

    return true;
}